

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O1

void av1_highbd_warp_affine_c
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  ushort *puVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  long local_2f0;
  int local_2e4;
  int aiStack_218 [122];
  
  iVar1 = conv_params->is_compound;
  bVar7 = (byte)conv_params->round_0;
  if (iVar1 == 0) {
    bVar17 = 0xe - bVar7;
  }
  else {
    bVar17 = (byte)conv_params->round_1;
  }
  if (0 < p_height) {
    cVar9 = (char)conv_params->round_1 + bVar7;
    bVar18 = 0xe - cVar9;
    bVar8 = (byte)bd;
    bVar19 = (bVar8 + 0xe) - cVar9;
    iVar22 = (1 << (bVar17 & 0x1f)) >> 1;
    iVar21 = 0;
    iVar13 = p_row;
    do {
      if (0 < p_width) {
        iVar2 = mat[2];
        iVar3 = mat[3];
        lVar14 = (long)(iVar13 + 4 << ((byte)subsampling_y & 0x1f));
        iVar4 = *mat;
        iVar5 = mat[4];
        iVar6 = mat[5];
        iVar10 = (p_height + p_row) - iVar13;
        iVar23 = iVar10 + -4;
        if (8 < iVar10) {
          iVar23 = 4;
        }
        iVar10 = mat[1];
        iVar12 = p_col;
        do {
          lVar15 = (long)(iVar12 + 4 << ((byte)subsampling_x & 0x1f));
          lVar27 = iVar2 * lVar15 + (long)iVar4 + iVar3 * lVar14 >> ((byte)subsampling_x & 0x3f);
          lVar15 = lVar15 * iVar5 + (long)iVar10 + iVar6 * lVar14 >> ((byte)subsampling_y & 0x3f);
          lVar20 = -7;
          do {
            lVar16 = (int)((ulong)lVar15 >> 0x10) + lVar20;
            iVar11 = (int)lVar16;
            iVar24 = height + -1;
            if (iVar11 < height + -1) {
              iVar24 = iVar11;
            }
            if (lVar16 < 0) {
              iVar24 = iVar21;
            }
            iVar30 = ((int)lVar20 + 4) * (int)beta +
                     (((uint)lVar27 & 0xfffc) + ((int)alpha + (int)beta) * -4 & 0xffffffc0);
            lVar16 = -4;
            iVar11 = (int)((ulong)lVar27 >> 0x10) + -7;
            do {
              lVar28 = 0;
              iVar32 = 1 << (bVar8 + 6 & 0x1f);
              do {
                iVar33 = iVar11 + (int)lVar28;
                if (width + -1 <= iVar33) {
                  iVar33 = width + -1;
                }
                if (iVar11 + lVar28 < 0) {
                  iVar33 = iVar21;
                }
                iVar32 = iVar32 + (int)*(short *)((long)(iVar30 + 0x200 >> 10) * 0x10 + 0x567870 +
                                                 lVar28 * 2) * (uint)ref[iVar33 + iVar24 * stride];
                lVar28 = lVar28 + 1;
              } while (lVar28 != 8);
              aiStack_218[lVar20 * 8 + 0x3c + lVar16] =
                   iVar32 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f);
              iVar30 = iVar30 + alpha;
              lVar16 = lVar16 + 1;
              iVar11 = iVar11 + 1;
            } while (lVar16 != 4);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 8);
          if (-4 < iVar23) {
            iVar11 = (p_width + p_col) - iVar12;
            iVar24 = iVar11 + -4;
            if (8 < iVar11) {
              iVar24 = 4;
            }
            iVar11 = (iVar12 - p_col) + 4;
            local_2f0 = -4;
            local_2e4 = 0;
            do {
              if (-4 < iVar24) {
                iVar32 = (iVar13 - p_row) + 4 + (int)local_2f0;
                iVar25 = iVar32 * p_stride;
                iVar33 = ((int)local_2f0 + 4) * (int)delta +
                         (((uint)lVar15 & 0xfffc) + ((int)delta + (int)gamma) * -4 & 0xffffffc0);
                lVar20 = -4;
                iVar30 = local_2e4;
                do {
                  lVar27 = 0;
                  iVar34 = 1 << ((bVar8 + 0xe) - bVar7 & 0x1f);
                  iVar26 = iVar30;
                  do {
                    iVar34 = iVar34 + (int)*(short *)((long)(iVar33 + 0x200 >> 10) * 0x10 + 0x567870
                                                     + lVar27 * 2) * aiStack_218[iVar26];
                    lVar27 = lVar27 + 1;
                    iVar26 = iVar26 + 8;
                  } while (lVar27 != 8);
                  if (iVar1 == 0) {
                    iVar26 = (iVar34 + iVar22 >> (bVar17 & 0x1f)) +
                             (-1 << (bVar8 & 0x1f)) + (-1 << (bVar8 - 1 & 0x1f));
                    if (bd == 10) {
                      iVar34 = 0x3ff;
                    }
                    else if (bd == 0xc) {
                      iVar34 = 0xfff;
                    }
                    else {
                      iVar34 = 0xff;
                    }
                    if (iVar34 <= iVar26) {
                      iVar26 = iVar34;
                    }
                    iVar29 = iVar11 + iVar25 + (int)lVar20;
LAB_003b1220:
                    puVar31 = pred + iVar29;
                    if (iVar26 < 1) {
                      iVar26 = iVar21;
                    }
                  }
                  else {
                    iVar29 = iVar11 + (int)lVar20;
                    iVar26 = iVar34 + iVar22 >> (bVar17 & 0x1f);
                    puVar31 = conv_params->dst + (conv_params->dst_stride * iVar32 + iVar29);
                    if (conv_params->do_average != 0) {
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        iVar26 = (int)(iVar26 + (uint)*puVar31) >> 1;
                      }
                      else {
                        iVar26 = (int)(iVar26 * conv_params->bck_offset +
                                      (uint)*puVar31 * conv_params->fwd_offset) >> 4;
                      }
                      iVar26 = iVar26 + ((1 << (bVar18 & 0x1f)) >> 1) +
                                        (-1 << (bVar19 - 1 & 0x1f)) + (-1 << (bVar19 & 0x1f)) >>
                               (bVar18 & 0x1f);
                      if (bd == 10) {
                        iVar34 = 0x3ff;
                      }
                      else if (bd == 0xc) {
                        iVar34 = 0xfff;
                      }
                      else {
                        iVar34 = 0xff;
                      }
                      if (iVar34 <= iVar26) {
                        iVar26 = iVar34;
                      }
                      iVar29 = iVar29 + iVar25;
                      goto LAB_003b1220;
                    }
                  }
                  *puVar31 = (ushort)iVar26;
                  iVar33 = iVar33 + gamma;
                  lVar20 = lVar20 + 1;
                  iVar30 = iVar30 + 1;
                } while (lVar20 < iVar24);
              }
              local_2f0 = local_2f0 + 1;
              local_2e4 = local_2e4 + 8;
            } while (local_2f0 < iVar23);
          }
          iVar12 = iVar12 + 8;
        } while (iVar12 < p_width + p_col);
      }
      iVar13 = iVar13 + 8;
    } while (iVar13 < p_height + p_row);
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_c(const int32_t *mat, const uint16_t *ref,
                              int width, int height, int stride, uint16_t *pred,
                              int p_col, int p_row, int p_width, int p_height,
                              int p_stride, int subsampling_x,
                              int subsampling_y, int bd,
                              ConvolveParams *conv_params, int16_t alpha,
                              int16_t beta, int16_t gamma, int16_t delta) {
  int32_t tmp[15 * 8];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  for (int i = p_row; i < p_row + p_height; i += 8) {
    for (int j = p_col; j < p_col + p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (j + 4) << subsampling_x;
      const int32_t src_y = (i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4);
      sy4 += gamma * (-4) + delta * (-4);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      for (int k = -7; k < 8; ++k) {
        const int iy = clamp(iy4 + k, 0, height - 1);

        int sx = sx4 + beta * (k + 4);
        for (int l = -4; l < 4; ++l) {
          int ix = ix4 + l - 3;
          const int offs = ROUND_POWER_OF_TWO(sx, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_horiz;
          for (int m = 0; m < 8; ++m) {
            const int sample_x = clamp(ix + m, 0, width - 1);
            sum += ref[iy * stride + sample_x] * coeffs[m];
          }
          sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
          assert(0 <= sum && sum < (1 << max_bits_horiz));
          tmp[(k + 7) * 8 + (l + 4)] = sum;
          sx += alpha;
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_row + p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        for (int l = -4; l < AOMMIN(4, p_col + p_width - j - 4); ++l) {
          const int offs = ROUND_POWER_OF_TWO(sy, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_vert;
          for (int m = 0; m < 8; ++m) {
            sum += tmp[(k + m + 4) * 8 + (l + 4)] * coeffs[m];
          }

          if (conv_params->is_compound) {
            CONV_BUF_TYPE *p =
                &conv_params
                     ->dst[(i - p_row + k + 4) * conv_params->dst_stride +
                           (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            if (conv_params->do_average) {
              uint16_t *dst16 =
                  &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
              int32_t tmp32 = *p;
              if (conv_params->use_dist_wtd_comp_avg) {
                tmp32 = tmp32 * conv_params->fwd_offset +
                        sum * conv_params->bck_offset;
                tmp32 = tmp32 >> DIST_PRECISION_BITS;
              } else {
                tmp32 += sum;
                tmp32 = tmp32 >> 1;
              }
              tmp32 = tmp32 - (1 << (offset_bits - conv_params->round_1)) -
                      (1 << (offset_bits - conv_params->round_1 - 1));
              *dst16 =
                  clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp32, round_bits), bd);
            } else {
              *p = sum;
            }
          } else {
            uint16_t *p =
                &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            assert(0 <= sum && sum < (1 << (bd + 2)));
            *p = clip_pixel_highbd(sum - (1 << (bd - 1)) - (1 << bd), bd);
          }
          sy += gamma;
        }
      }
    }
  }
}